

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O3

QDeviceDiscovery * QDeviceDiscovery::create(QDeviceTypes types,QObject *parent)

{
  QDebug this;
  udev *udev;
  QDeviceDiscovery *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lcDD();
  if (((byte)lcDD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    this.stream = local_58.stream;
    QVar1.m_data = (storage_type *)0x1e;
    QVar1.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<((QTextStream *)this.stream,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    *(int *)((QTextStream *)local_58.stream + 0x28) =
         *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
    qt_QMetaEnum_flagDebugOperator
              (&local_48,(ulonglong)&local_50,
               (QMetaObject *)
               (ulong)(uint)types.super_QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>.
                            super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
  }
  udev = (udev *)udev_new();
  if (udev == (udev *)0x0) {
    create();
    this_00 = (QDeviceDiscovery *)0x0;
  }
  else {
    this_00 = (QDeviceDiscovery *)operator_new(0x38);
    QDeviceDiscoveryUDev::QDeviceDiscoveryUDev((QDeviceDiscoveryUDev *)this_00,types,udev,parent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}